

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int nameNsPush(xmlParserCtxtPtr ctxt,xmlChar *value,xmlChar *prefix,xmlChar *URI,int line,int nsNr)

{
  int iVar1;
  xmlChar **ppxVar2;
  xmlStartTag *pxVar3;
  int newSize;
  xmlStartTag *tmp2;
  xmlChar **tmp;
  xmlStartTag *tag;
  int nsNr_local;
  int line_local;
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *value_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->nameNr < ctxt->nameMax) {
    if (ctxt->pushTab == (xmlStartTag *)0x0) {
      pxVar3 = (xmlStartTag *)(*xmlMalloc)((long)ctxt->nameMax * 0x18);
      ctxt->pushTab = pxVar3;
      if (ctxt->pushTab == (xmlStartTag *)0x0) goto LAB_00155472;
    }
LAB_001553df:
    ctxt->nameTab[ctxt->nameNr] = value;
    ctxt->name = value;
    pxVar3 = ctxt->pushTab + ctxt->nameNr;
    pxVar3->prefix = prefix;
    pxVar3->URI = URI;
    pxVar3->line = line;
    pxVar3->nsNr = nsNr;
    ctxt_local._4_4_ = ctxt->nameNr;
    ctxt->nameNr = ctxt_local._4_4_ + 1;
  }
  else {
    iVar1 = xmlGrowCapacity(ctxt->nameMax,0x20,10,1000000000);
    if ((-1 < iVar1) &&
       (ppxVar2 = (xmlChar **)(*xmlRealloc)(ctxt->nameTab,(long)iVar1 << 3),
       ppxVar2 != (xmlChar **)0x0)) {
      ctxt->nameTab = ppxVar2;
      pxVar3 = (xmlStartTag *)(*xmlRealloc)(ctxt->pushTab,(long)iVar1 * 0x18);
      if (pxVar3 != (xmlStartTag *)0x0) {
        ctxt->pushTab = pxVar3;
        ctxt->nameMax = iVar1;
        goto LAB_001553df;
      }
    }
LAB_00155472:
    xmlErrMemory(ctxt);
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
nameNsPush(xmlParserCtxtPtr ctxt, const xmlChar * value,
           const xmlChar *prefix, const xmlChar *URI, int line, int nsNr)
{
    xmlStartTag *tag;

    if (ctxt->nameNr >= ctxt->nameMax) {
        const xmlChar **tmp;
        xmlStartTag *tmp2;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->nameMax,
                                  sizeof(tmp[0]) + sizeof(tmp2[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0)
            goto mem_error;

        tmp = xmlRealloc(ctxt->nameTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL)
	    goto mem_error;
	ctxt->nameTab = tmp;

        tmp2 = xmlRealloc(ctxt->pushTab, newSize * sizeof(tmp2[0]));
        if (tmp2 == NULL)
	    goto mem_error;
	ctxt->pushTab = tmp2;

        ctxt->nameMax = newSize;
    } else if (ctxt->pushTab == NULL) {
        ctxt->pushTab = xmlMalloc(ctxt->nameMax * sizeof(ctxt->pushTab[0]));
        if (ctxt->pushTab == NULL)
            goto mem_error;
    }
    ctxt->nameTab[ctxt->nameNr] = value;
    ctxt->name = value;
    tag = &ctxt->pushTab[ctxt->nameNr];
    tag->prefix = prefix;
    tag->URI = URI;
    tag->line = line;
    tag->nsNr = nsNr;
    return (ctxt->nameNr++);
mem_error:
    xmlErrMemory(ctxt);
    return (-1);
}